

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_unique_id(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT *id)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  bool bVar4;
  REF_INT RVar5;
  ulong uVar6;
  
  RVar5 = -1;
  uVar6 = 0xffffffff;
  if (-1 < node) {
    pRVar2 = ref_geom->ref_adj;
    uVar6 = 0xffffffff;
    RVar5 = -1;
    if (node < pRVar2->nnode) {
      uVar1 = pRVar2->first[(uint)node];
      uVar6 = 0xffffffff;
      RVar5 = -1;
      if ((long)(int)uVar1 != -1) {
        RVar5 = pRVar2->item[(int)uVar1].ref;
        uVar6 = (ulong)uVar1;
      }
    }
  }
  bVar4 = false;
  do {
    if ((int)uVar6 == -1) {
      return (uint)!bVar4 * 5;
    }
    if (ref_geom->descr[RVar5 * 6] == type) {
      if (bVar4) {
        return 3;
      }
      *id = ref_geom->descr[(int)(RVar5 * 6 | 1)];
      bVar4 = true;
    }
    pRVar3 = ref_geom->ref_adj->item;
    uVar6 = (ulong)pRVar3[(int)uVar6].next;
    RVar5 = -1;
    if (uVar6 != 0xffffffffffffffff) {
      RVar5 = pRVar3[uVar6].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_geom_unique_id(REF_GEOM ref_geom, REF_INT node,
                                      REF_INT type, REF_INT *id) {
  REF_INT item, geom;
  REF_BOOL found_one;
  found_one = REF_FALSE;
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom)) {
      if (found_one) return REF_INVALID; /* second one makes invalid */
      found_one = REF_TRUE;
      *id = ref_geom_id(ref_geom, geom);
    }
  }
  if (found_one) return REF_SUCCESS;
  return REF_NOT_FOUND;
}